

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O3

void __thiscall SmallVector_Clear_Test::TestBody(SmallVector_Clear_Test *this)

{
  char *pcVar1;
  small_vector<int,_256UL> a;
  AssertHelper local_458;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_450;
  internal local_448 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  undefined8 local_438;
  undefined1 local_430 [1024];
  void *local_30;
  void *local_28;
  long local_20;
  undefined1 *local_18;
  
  local_438 = 4;
  memset(local_430,0,0x418);
  local_458.data_._0_4_ = 4;
  local_450._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_18 = local_430;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_448,"4U","a.size ()",(uint *)&local_458,(unsigned_long *)&local_450);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_450);
    if (local_440 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_440->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x100,pcVar1);
    testing::internal::AssertHelper::operator=(&local_458,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    if (local_450._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_450._M_head_impl + 8))();
    }
  }
  if (local_440 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_440,local_440);
  }
  if (local_28 != local_30) {
    local_28 = local_30;
  }
  local_438 = 0;
  local_458.data_._0_4_ = 0;
  local_450._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_18 = local_430;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_448,"0U","a.size ()",(uint *)&local_458,(unsigned_long *)&local_450);
  if (local_448[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_450);
    if (local_440 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_440->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x102,pcVar1);
    testing::internal::AssertHelper::operator=(&local_458,(Message *)&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    if (local_450._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_450._M_head_impl + 8))();
    }
  }
  if (local_440 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_440,local_440);
  }
  if (local_30 != (void *)0x0) {
    operator_delete(local_30,local_20 - (long)local_30);
  }
  return;
}

Assistant:

TEST (SmallVector, Clear) {
    // The two containers start out with different sizes; one uses the small
    // buffer, the other, large.
    pstore::small_vector<int> a (std::size_t{4});
    EXPECT_EQ (4U, a.size ());
    a.clear ();
    EXPECT_EQ (0U, a.size ());
}